

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O0

void __thiscall
boomphf::bfile_iterator<unsigned_long>::bfile_iterator
          (bfile_iterator<unsigned_long> *this,bfile_iterator<unsigned_long> *cr)

{
  void *pvVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  *(undefined4 *)(in_RDI + 5) = *(undefined4 *)(in_RSI + 5);
  in_RDI[2] = in_RSI[2];
  in_RDI[1] = in_RSI[1];
  pvVar1 = malloc((long)*(int *)(in_RDI + 5) << 3);
  in_RDI[3] = pvVar1;
  memcpy((void *)in_RDI[3],(void *)in_RSI[3],(long)*(int *)(in_RDI + 5) << 3);
  *(undefined4 *)(in_RDI + 4) = *(undefined4 *)(in_RSI + 4);
  *(undefined4 *)((long)in_RDI + 0x24) = *(undefined4 *)((long)in_RSI + 0x24);
  *in_RDI = *in_RSI;
  return;
}

Assistant:

bfile_iterator(const bfile_iterator& cr)
		{
			_buffsize = cr._buffsize;
			_pos = cr._pos;
			_is = cr._is;
			_buffer = (basetype *) malloc(_buffsize*sizeof(basetype));
			 memcpy(_buffer,cr._buffer,_buffsize*sizeof(basetype) );
			_inbuff = cr._inbuff;
			_cptread = cr._cptread;
			_elem = cr._elem;
		}